

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

void __thiscall
andres::View<int,_false,_std::allocator<unsigned_long>_>::shift
          (View<int,_false,_std::allocator<unsigned_long>_> *this,int n)

{
  size_type __n;
  int n_00;
  runtime_error *prVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> p;
  allocator_type local_29;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_28;
  
  testInvariant(this);
  if (this->data_ == (pointer)0x0) {
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar1,"Assertion failed.");
LAB_0023103e:
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  __n = (this->geometry_).dimension_;
  if (__n == 0) {
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar1,"Assertion failed.");
    goto LAB_0023103e;
  }
  iVar2 = (int)__n;
  n_00 = n - iVar2;
  if (-iVar2 < n && n < iVar2) {
    if (n < 1) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_28,__n,&local_29);
      if (this->data_ == (pointer)0x0) {
        prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar1,"Assertion failed.");
        __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar3 = (this->geometry_).dimension_;
      if (uVar3 != 0) {
        uVar4 = 0;
        do {
          local_28.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar4] = (ulong)(long)((int)uVar4 - n) % uVar3;
          uVar4 = uVar4 + 1;
          uVar3 = (this->geometry_).dimension_;
        } while (uVar4 < uVar3);
      }
      View<int,false,std::allocator<unsigned_long>>::
      permute<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((View<int,false,std::allocator<unsigned_long>> *)this,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )local_28.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start);
      if (local_28.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
        operator_delete(local_28.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_28.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_28.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      goto LAB_00230f87;
    }
  }
  else {
    n_00 = n % iVar2;
  }
  shift(this,n_00);
LAB_00230f87:
  testInvariant(this);
  return;
}

Assistant:

inline void
View<T, isConst, A>::shift
(
    const int n
) 
{
    testInvariant();
    marray_detail::Assert(MARRAY_NO_DEBUG || dimension() != 0);
    if(n <= -static_cast<int>(dimension()) || n >= static_cast<int>(dimension())) {
        shift(n % static_cast<int>(dimension()));
    }
    else {
        if(n > 0) {
            shift(n - static_cast<int>(dimension()));
        }
        else {
            std::vector<std::size_t> p(dimension());
            for(std::size_t j=0; j<dimension(); ++j) {
                p[j] = static_cast<std::size_t>((static_cast<int>(j) - n)) % dimension();
            }
            permute(p.begin());
        }
    }
    testInvariant();
}